

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O2

void __thiscall DataFileTest::testReaderGenericByName(DataFileTest *this)

{
  ssize_t sVar1;
  GenericRecord *this_00;
  GenericDatum *pGVar2;
  long *plVar3;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int iVar4;
  DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_> *this_01;
  any *operand;
  string *psVar5;
  long local_208;
  undefined4 local_1fc;
  string local_1f8;
  int i;
  size_t n;
  int64_t im;
  int64_t re;
  DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_> df;
  Pair p;
  char *local_180;
  char *local_178;
  const_string local_170;
  const_string local_160;
  char *local_150;
  char *local_148;
  const_string local_140;
  const_string local_130;
  char *local_120;
  char *local_118;
  const_string local_110;
  const_string local_100;
  char *local_f0;
  char *local_e8;
  const_string local_e0;
  const_string local_d0;
  char *local_c0;
  char *local_b8;
  const_string local_b0;
  const_string local_a0;
  char *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  avro::DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::DataFileReader
            (&df,this->filename,&this->writerSchema);
  i = 0;
  p.first.root_.px = (this->writerSchema).root_.px;
  p.first.root_.pn.pi_ = (this->writerSchema).root_.pn.pi_;
  if (p.first.root_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (p.first.root_.pn.pi_)->use_count_ = (p.first.root_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  p.second.type_ = AVRO_NULL;
  p.second.value_.content = (placeholder *)0x0;
  re = 3;
  im = 5;
  __buf = extraout_RDX;
  iVar4 = 1;
  while( true ) {
    this_01 = &df;
    sVar1 = avro::DataFileReader<std::pair<avro::ValidSchema,_avro::GenericDatum>_>::read
                      (this_01,(int)&p,__buf,in_RCX);
    if ((char)sVar1 == '\0') break;
    local_70.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_70.m_end = "";
    local_80.m_begin = "";
    local_80.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_01,&local_70,0x12d,&local_80);
    local_1f8._M_string_length._0_1_ = 0;
    local_1f8._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001d0ff0;
    local_1f8.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_1f8.field_2._8_8_ = (long)"\t" + 1;
    local_90 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_88 = "";
    n = CONCAT44(n._4_4_,p.second.type_);
    local_208 = CONCAT44(local_208._4_4_,8);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::Type,avro::Type>
              (&local_1f8,&local_90,0x12d,2,2,&n,"ci.type()",&local_208,"avro::AVRO_RECORD");
    operand = &p.second.value_;
    this_00 = boost::any_cast<avro::GenericRecord>(operand);
    n = 2;
    local_a0.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_a0.m_end = "";
    local_b0.m_begin = "";
    local_b0.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)operand,&local_a0,0x130,&local_b0);
    local_1f8._M_string_length._0_1_ = 0;
    local_1f8._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001d0ff0;
    local_1f8.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_1f8.field_2._8_8_ = (long)"\t" + 1;
    local_c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_b8 = "";
    local_208 = *(long *)(this_00 + 0x18) - *(long *)(this_00 + 0x10) >> 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_1f8,&local_c0,0x130,2,2,&local_208,"r.fieldCount()",&n,"n");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"re",(allocator<char> *)&local_208);
    pGVar2 = avro::GenericRecord::field(this_00,&local_1f8);
    psVar5 = &local_1f8;
    std::__cxx11::string::~string((string *)&local_1f8);
    local_d0.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_d0.m_end = "";
    local_e0.m_begin = "";
    local_e0.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)psVar5,&local_d0,0x132,&local_e0);
    local_1f8._M_string_length._0_1_ = 0;
    local_1f8._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001d0ff0;
    local_1f8.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_1f8.field_2._8_8_ = (long)"\t" + 1;
    local_f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_e8 = "";
    local_1fc = 3;
    psVar5 = &local_1f8;
    local_208._0_4_ = pGVar2->type_;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::Type,avro::Type>
              (&local_1f8,&local_f0,0x132,2,2,&local_208,"f0.type()",&local_1fc,"avro::AVRO_LONG");
    local_100.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_100.m_end = "";
    local_110.m_begin = "";
    local_110.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)psVar5,&local_100,0x133,&local_110);
    local_1f8._M_string_length._0_1_ = 0;
    local_1f8._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001d0ff0;
    local_1f8.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_1f8.field_2._8_8_ = (long)"\t" + 1;
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_118 = "";
    plVar3 = boost::any_cast<long>(&pGVar2->value_);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_1f8,&local_120,0x133,1,2,plVar3,"f0.value<int64_t>()",&re,"re");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"im",(allocator<char> *)&local_208);
    pGVar2 = avro::GenericRecord::field(this_00,&local_1f8);
    psVar5 = &local_1f8;
    std::__cxx11::string::~string((string *)&local_1f8);
    local_130.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_130.m_end = "";
    local_140.m_begin = "";
    local_140.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)psVar5,&local_130,0x136,&local_140);
    local_1f8._M_string_length._0_1_ = 0;
    local_1f8._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001d0ff0;
    local_1f8.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_1f8.field_2._8_8_ = (long)"\t" + 1;
    local_150 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_148 = "";
    local_208 = CONCAT44(local_208._4_4_,pGVar2->type_);
    local_1fc = 3;
    psVar5 = &local_1f8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::Type,avro::Type>
              (&local_1f8,&local_150,0x136,2,2,&local_208,"f1.type()",&local_1fc,"avro::AVRO_LONG");
    local_160.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_160.m_end = "";
    local_170.m_begin = "";
    local_170.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)psVar5,&local_160,0x137,&local_170);
    local_1f8._M_string_length._0_1_ = 0;
    local_1f8._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001d0ff0;
    local_1f8.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
    local_1f8.field_2._8_8_ = (long)"\t" + 1;
    local_180 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_178 = "";
    plVar3 = boost::any_cast<long>(&pGVar2->value_);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_1f8,&local_180,0x137,1,2,plVar3,"f1.value<int64_t>()",&im,"im");
    in_RCX = re * im;
    im = im + 3;
    __buf = extraout_RDX_00;
    i = iVar4;
    re = in_RCX;
    iVar4 = iVar4 + 1;
  }
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_01,&local_40,0x13c,&local_50);
  local_1f8._M_string_length._0_1_ = 0;
  local_1f8._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_001d0ff0;
  local_1f8.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_1f8.field_2._8_8_ = (long)"\t" + 1;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_1f8,&local_60,0x13c,1,2,&i,"i",&count,"count");
  std::pair<avro::ValidSchema,_avro::GenericDatum>::~pair(&p);
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr(&df.base_);
  return;
}

Assistant:

void testReaderGenericByName() {
        avro::DataFileReader<Pair> df(filename, writerSchema);
        int i = 0;
        Pair p(writerSchema, GenericDatum());
        int64_t re = 3;
        int64_t im = 5;

        const GenericDatum& ci = p.second;
        while (df.read(p)) {
            BOOST_REQUIRE_EQUAL(ci.type(), avro::AVRO_RECORD);
            const GenericRecord& r = ci.value<GenericRecord>();
            const size_t n = 2;
            BOOST_REQUIRE_EQUAL(r.fieldCount(), n);
            const GenericDatum& f0 = r.field("re");
            BOOST_REQUIRE_EQUAL(f0.type(), avro::AVRO_LONG);
            BOOST_CHECK_EQUAL(f0.value<int64_t>(), re);

            const GenericDatum& f1 = r.field("im");
            BOOST_REQUIRE_EQUAL(f1.type(), avro::AVRO_LONG);
            BOOST_CHECK_EQUAL(f1.value<int64_t>(), im);
            re *= im;
            im += 3;
            ++i;
        }
        BOOST_CHECK_EQUAL(i, count);
    }